

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O2

bool __thiscall cmCTestCVS::UpdateParser::ProcessLine(UpdateParser *this)

{
  string *s;
  bool bVar1;
  string local_40;
  
  s = &(this->super_LineParser).Line;
  bVar1 = cmsys::RegularExpression::find(&this->RegexFileUpdated,s);
  if (bVar1) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_40,&(this->RegexFileUpdated).regmatch,2);
    DoFile(this,PathUpdated,&local_40);
  }
  else {
    bVar1 = cmsys::RegularExpression::find(&this->RegexFileModified,s);
    if (bVar1) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_
                (&local_40,&(this->RegexFileModified).regmatch,2);
      DoFile(this,PathModified,&local_40);
    }
    else {
      bVar1 = cmsys::RegularExpression::find(&this->RegexFileConflicting,s);
      if (bVar1) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_
                  (&local_40,&(this->RegexFileConflicting).regmatch,2);
        DoFile(this,PathConflicting,&local_40);
      }
      else {
        bVar1 = cmsys::RegularExpression::find(&this->RegexFileRemoved1,s);
        if (bVar1) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_40,&(this->RegexFileRemoved1).regmatch,1);
          DoFile(this,PathUpdated,&local_40);
        }
        else {
          bVar1 = cmsys::RegularExpression::find(&this->RegexFileRemoved2,s);
          if (!bVar1) {
            return true;
          }
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_40,&(this->RegexFileRemoved2).regmatch,1);
          DoFile(this,PathUpdated,&local_40);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_40);
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexFileUpdated.find(this->Line)) {
      this->DoFile(PathUpdated, this->RegexFileUpdated.match(2));
    } else if (this->RegexFileModified.find(this->Line)) {
      this->DoFile(PathModified, this->RegexFileModified.match(2));
    } else if (this->RegexFileConflicting.find(this->Line)) {
      this->DoFile(PathConflicting, this->RegexFileConflicting.match(2));
    } else if (this->RegexFileRemoved1.find(this->Line)) {
      this->DoFile(PathUpdated, this->RegexFileRemoved1.match(1));
    } else if (this->RegexFileRemoved2.find(this->Line)) {
      this->DoFile(PathUpdated, this->RegexFileRemoved2.match(1));
    }
    return true;
  }